

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool wabt::anon_unknown_1::ResolveFuncTypeWithEmptySignature(Module *module,FuncDeclaration *decl)

{
  bool bVar1;
  FuncType *pFVar2;
  FuncType *func_type;
  FuncDeclaration *decl_local;
  Module *module_local;
  
  if ((((decl->has_func_type & 1U) == 0) || (bVar1 = IsEmptySignature(&decl->sig), !bVar1)) ||
     (pFVar2 = Module::GetFuncType(module,&decl->type_var), pFVar2 == (FuncType *)0x0)) {
    module_local._7_1_ = false;
  }
  else {
    FuncSignature::operator=(&decl->sig,&pFVar2->sig);
    module_local._7_1_ = true;
  }
  return module_local._7_1_;
}

Assistant:

bool ResolveFuncTypeWithEmptySignature(const Module& module,
                                       FuncDeclaration* decl) {
  // Resolve func type variables where the signature was not specified
  // explicitly, e.g.: (func (type 1) ...)
  if (decl->has_func_type && IsEmptySignature(decl->sig)) {
    const FuncType* func_type = module.GetFuncType(decl->type_var);
    if (func_type) {
      decl->sig = func_type->sig;
      return true;
    }
  }
  return false;
}